

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O0

void __thiscall NaControlLaw::~NaControlLaw(NaControlLaw *this)

{
  void *in_RDI;
  NaControlLaw *unaff_retaddr;
  
  ~NaControlLaw(unaff_retaddr);
  operator_delete(in_RDI,400);
  return;
}

Assistant:

NaControlLaw::~NaControlLaw ()
{
    delete dataio;
    delete[] filepath;
}